

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int LoadEXRFromMemory(float *out_rgba,uchar *memory,char **err)

{
  uchar *puVar1;
  uchar *puVar2;
  uchar *puVar3;
  char **ppcVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  EXRImage exrImage;
  uint local_10b0;
  uint local_10ac;
  uint local_10a8;
  uint local_10a4;
  EXRImage local_1098;
  
  if (out_rgba == (float *)0x0 || memory == (uchar *)0x0) {
    if (err != (char **)0x0) {
      *err = "Invalid argument.\n";
      return -1;
    }
    return -1;
  }
  local_1098.images = (uchar **)0x0;
  local_1098.pixel_types = (int *)0x0;
  local_1098.num_custom_attributes = 0;
  local_1098.num_channels = 0;
  local_1098.channel_names = (char **)0x0;
  local_1098.requested_pixel_types = (int *)0x0;
  local_1098.compression = 3;
  iVar8 = LoadMultiChannelEXRFromMemory(&local_1098,memory,err);
  ppcVar4 = local_1098.channel_names;
  if (iVar8 != 0) {
    return iVar8;
  }
  lVar12 = (long)local_1098.num_channels;
  if (lVar12 < 1) {
    local_10a4 = 0xffffffff;
    local_10a8 = 0xffffffff;
    local_10ac = 0xffffffff;
    local_10b0 = 0xffffffff;
  }
  else {
    local_10b0 = 0xffffffff;
    lVar11 = 0;
    local_10ac = 0xffffffff;
    local_10a8 = 0xffffffff;
    local_10a4 = 0xffffffff;
    do {
      pcVar9 = ppcVar4[lVar11];
      iVar8 = strcmp(pcVar9,"R");
      uVar10 = (uint)lVar11;
      uVar5 = local_10ac;
      uVar6 = local_10a8;
      uVar7 = uVar10;
      if ((((iVar8 != 0) &&
           (iVar8 = strcmp(pcVar9,"G"), uVar6 = uVar10, uVar7 = local_10a4, iVar8 != 0)) &&
          (iVar8 = strcmp(pcVar9,"B"), uVar5 = uVar10, uVar6 = local_10a8, iVar8 != 0)) &&
         (iVar8 = strcmp(pcVar9,"A"), uVar5 = local_10ac, iVar8 == 0)) {
        local_10b0 = uVar10;
      }
      local_10a4 = uVar7;
      local_10a8 = uVar6;
      local_10ac = uVar5;
      lVar11 = lVar11 + 1;
    } while (lVar12 != lVar11);
  }
  if (local_10a4 == 0xffffffff) {
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar9 = "R channel not found\n";
  }
  else if (local_10a8 == 0xffffffff) {
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar9 = "G channel not found\n";
  }
  else {
    if (local_10ac != 0xffffffff) {
      if (0 < local_1098.height * local_1098.width) {
        puVar1 = local_1098.images[(int)local_10a4];
        puVar2 = local_1098.images[(int)local_10a8];
        puVar3 = local_1098.images[(int)local_10ac];
        lVar12 = 0;
        do {
          out_rgba[lVar12] = *(float *)(puVar1 + lVar12);
          out_rgba[lVar12 + 1] = *(float *)(puVar2 + lVar12);
          out_rgba[lVar12 + 2] = *(float *)(puVar3 + lVar12);
          fVar13 = 1.0;
          if (0 < (int)local_10b0) {
            fVar13 = *(float *)(local_1098.images[local_10b0] + lVar12);
          }
          out_rgba[lVar12 + 3] = fVar13;
          lVar12 = lVar12 + 4;
        } while ((ulong)(uint)(local_1098.height * local_1098.width) << 2 != lVar12);
      }
      return 0;
    }
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar9 = "B channel not found\n";
  }
  *err = pcVar9;
  return -1;
}

Assistant:

int LoadEXRFromMemory(float *out_rgba, const unsigned char *memory,
                      const char **err) {

  if (out_rgba == NULL || memory == NULL) {
    if (err) {
      (*err) = "Invalid argument.\n";
    }
    return -1;
  }

  EXRImage exrImage;
  InitEXRImage(&exrImage);
  int ret = LoadMultiChannelEXRFromMemory(&exrImage, memory, err);
  if (ret != 0) {
    return ret;
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;
  for (int c = 0; c < exrImage.num_channels; c++) {
    if (strcmp(exrImage.channel_names[c], "R") == 0) {
      idxR = c;
    } else if (strcmp(exrImage.channel_names[c], "G") == 0) {
      idxG = c;
    } else if (strcmp(exrImage.channel_names[c], "B") == 0) {
      idxB = c;
    } else if (strcmp(exrImage.channel_names[c], "A") == 0) {
      idxA = c;
    }
  }

  if (idxR == -1) {
    if (err) {
      (*err) = "R channel not found\n";
    }

    // @todo { free exrImage }
    return -1;
  }

  if (idxG == -1) {
    if (err) {
      (*err) = "G channel not found\n";
    }
    // @todo { free exrImage }
    return -1;
  }

  if (idxB == -1) {
    if (err) {
      (*err) = "B channel not found\n";
    }
    // @todo { free exrImage }
    return -1;
  }

  // Assume `out_rgba` have enough memory allocated.
  for (int i = 0; i < exrImage.width * exrImage.height; i++) {
    out_rgba[4 * i + 0] = reinterpret_cast<float **>(exrImage.images)[idxR][i];
    out_rgba[4 * i + 1] = reinterpret_cast<float **>(exrImage.images)[idxG][i];
    out_rgba[4 * i + 2] = reinterpret_cast<float **>(exrImage.images)[idxB][i];
    if (idxA > 0) {
      out_rgba[4 * i + 3] =
          reinterpret_cast<float **>(exrImage.images)[idxA][i];
    } else {
      out_rgba[4 * i + 3] = 1.0;
    }
  }

  return 0;
}